

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O3

void __thiscall SQOuterVar::SQOuterVar(SQOuterVar *this,SQOuterVar *ov)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  
  (this->_name).super_SQObject._type = OT_NULL;
  (this->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_src).super_SQObject._type = OT_NULL;
  (this->_src).super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_type = ov->_type;
  pSVar3 = (ov->_src).super_SQObject._unVal.pTable;
  (this->_src).super_SQObject._unVal.pTable = pSVar3;
  SVar2 = (ov->_src).super_SQObject._type;
  (this->_src).super_SQObject._type = SVar2;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  pSVar3 = (ov->_name).super_SQObject._unVal.pTable;
  (this->_name).super_SQObject._unVal.pTable = pSVar3;
  SVar2 = (ov->_name).super_SQObject._type;
  (this->_name).super_SQObject._type = SVar2;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  return;
}

Assistant:

SQOuterVar(const SQOuterVar &ov)
    {
        _type=ov._type;
        _src=ov._src;
        _name=ov._name;
    }